

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::CordOutputStreamTest_Empty_Test::TestBody
          (CordOutputStreamTest_Empty_Test *this)

{
  pointer *__ptr;
  ulong uVar1;
  char *in_R9;
  CordOutputStream output;
  AssertHelper AStack_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  CordOutputStream local_48;
  
  CordOutputStream::CordOutputStream(&local_48,0);
  CordOutputStream::Consume((CordOutputStream *)local_68);
  if (((long)(char)local_68[0] & 1U) == 0) {
    uVar1 = (ulong)(long)(char)local_68[0] >> 1;
  }
  else {
    uVar1 = *(ulong *)local_68._8_8_;
  }
  local_78[0] = (internal)(uVar1 == 0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  absl::lts_20250127::Cord::~Cord((Cord *)local_68);
  if (uVar1 != 0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,local_78,(AssertionResult *)"output.Consume().empty()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x3e2,(char *)CONCAT71(local_68._1_7_,local_68[0]));
    testing::internal::AssertHelper::operator=(&AStack_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&AStack_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_68._1_7_,local_68[0]) != &local_58) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_68._1_7_,local_68[0]),
                      (ulong)(local_58._M_allocated_capacity + 1));
    }
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
  }
  if ((local_48.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_48.buffer_.rep_.field_0._1_7_,
                        local_48.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_48.cord_);
  return;
}

Assistant:

TEST(CordOutputStreamTest, Empty) {
  CordOutputStream output;
  EXPECT_TRUE(output.Consume().empty());
}